

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

void __thiscall testing::internal::DeathTestImpl::ReadAndInterpretStatusByte(DeathTestImpl *this)

{
  undefined8 *puVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  long *plVar5;
  ostream *poVar6;
  size_t sVar7;
  undefined8 *puVar8;
  long *plVar9;
  ulong *puVar10;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  size_type *psVar12;
  ulong uVar13;
  undefined8 uVar14;
  string *this_00;
  uint uVar15;
  char flag;
  Message error;
  char buffer [256];
  byte local_211;
  undefined8 *local_210;
  undefined8 local_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  string local_1f0;
  ulong *local_1d0;
  long local_1c8;
  ulong local_1c0;
  long lStack_1b8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1b0;
  long local_1a8;
  long local_1a0;
  long lStack_198;
  int local_18c;
  string local_188;
  long *local_168;
  long local_160;
  long local_158;
  long lStack_150;
  undefined1 *local_148 [2];
  undefined1 local_138 [16];
  string local_128 [8];
  
LAB_0014cce2:
  sVar3 = read(this->read_fd_,&local_211,1);
  iVar2 = (int)sVar3;
  if (iVar2 == -1) goto code_r0x0014ccfb;
  if (iVar2 == 0) {
    this->outcome_ = DIED;
    goto LAB_0014cde7;
  }
  if (iVar2 == 1) {
    if (local_211 < 0x52) {
      if (local_211 == 0x49) {
        iVar2 = this->read_fd_;
        Message::Message((Message *)&local_1b0);
        do {
          while( true ) {
            sVar3 = read(iVar2,local_128,0xff);
            uVar15 = (uint)sVar3;
            if ((int)uVar15 < 1) break;
            *(undefined1 *)((long)&local_128[0]._M_dataplus._M_p + (ulong)(uVar15 & 0x7fffffff)) = 0
            ;
            poVar6 = (ostream *)(local_1b0._M_head_impl + 0x10);
            sVar7 = strlen((char *)local_128);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_128,sVar7);
          }
        } while ((uVar15 == 0xffffffff) && (piVar4 = __errno_location(), *piVar4 == 4));
        if (uVar15 == 0) {
          GTestLog::GTestLog((GTestLog *)&local_210,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/utils/unittest/googletest/src/gtest-death-test.cc"
                             ,0x167);
          StringStreamToString(&local_1f0,local_1b0._M_head_impl);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
        }
        else {
          piVar4 = __errno_location();
          iVar2 = *piVar4;
          GTestLog::GTestLog((GTestLog *)&local_210,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/utils/unittest/googletest/src/gtest-death-test.cc"
                             ,0x16a);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error while reading death test internal: ",0x29);
          GetLastErrnoDescription_abi_cxx11_();
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,local_1f0._M_dataplus._M_p,
                              local_1f0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," [",2);
          poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,iVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
        }
        GTestLog::~GTestLog((GTestLog *)&local_210);
        if (local_1b0._M_head_impl != (stringstream *)0x0) {
          (**(code **)(*(long *)local_1b0._M_head_impl + 8))();
        }
      }
      else {
        if (local_211 != 0x4c) goto LAB_0014ce93;
        this->outcome_ = LIVED;
      }
      goto LAB_0014cde7;
    }
    if (local_211 == 0x54) {
      this->outcome_ = THREW;
      goto LAB_0014cde7;
    }
    if (local_211 == 0x52) {
      this->outcome_ = RETURNED;
      goto LAB_0014cde7;
    }
LAB_0014ce93:
    this_00 = local_128;
    GTestLog::GTestLog((GTestLog *)this_00,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/utils/unittest/googletest/src/gtest-death-test.cc"
                       ,0x1ea);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Death test child process reported ",0x22);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"unexpected status byte (",0x18);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    goto LAB_0014cde2;
  }
  goto LAB_0014cd68;
code_r0x0014ccfb:
  piVar4 = __errno_location();
  if (*piVar4 != 4) goto LAB_0014cd68;
  goto LAB_0014cce2;
LAB_0014cd68:
  GTestLog::GTestLog((GTestLog *)&local_1f0,GTEST_FATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/utils/unittest/googletest/src/gtest-death-test.cc"
                     ,0x1ef);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Read from death test child process failed: ",0x2b);
  GetLastErrnoDescription_abi_cxx11_();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,local_128[0]._M_dataplus._M_p,local_128[0]._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128[0]._M_dataplus._M_p != &local_128[0].field_2) {
    operator_delete(local_128[0]._M_dataplus._M_p,local_128[0].field_2._M_allocated_capacity + 1);
  }
  this_00 = &local_1f0;
LAB_0014cde2:
  GTestLog::~GTestLog((GTestLog *)this_00);
LAB_0014cde7:
  do {
    iVar2 = close(this->read_fd_);
    if (iVar2 != -1) {
      this->read_fd_ = -1;
      return;
    }
    piVar4 = __errno_location();
  } while (*piVar4 == 4);
  local_148[0] = local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"CHECK failed: File ","");
  plVar5 = (long *)std::__cxx11::string::append((char *)local_148);
  local_168 = (long *)*plVar5;
  plVar9 = plVar5 + 2;
  if (local_168 == plVar9) {
    local_158 = *plVar9;
    lStack_150 = plVar5[3];
    local_168 = &local_158;
  }
  else {
    local_158 = *plVar9;
  }
  local_160 = plVar5[1];
  *plVar5 = (long)plVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_168);
  local_1d0 = (ulong *)*plVar5;
  puVar10 = (ulong *)(plVar5 + 2);
  if (local_1d0 == puVar10) {
    local_1c0 = *puVar10;
    lStack_1b8 = plVar5[3];
    local_1d0 = &local_1c0;
  }
  else {
    local_1c0 = *puVar10;
  }
  local_1c8 = plVar5[1];
  *plVar5 = (long)puVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_18c = 0x1f2;
  StreamableToString<int>(&local_188,&local_18c);
  uVar13 = 0xf;
  if (local_1d0 != &local_1c0) {
    uVar13 = local_1c0;
  }
  if (uVar13 < local_188._M_string_length + local_1c8) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      uVar14 = local_188.field_2._M_allocated_capacity;
    }
    if (local_188._M_string_length + local_1c8 <= (ulong)uVar14) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_188,0,(char *)0x0,(ulong)local_1d0);
      goto LAB_0014d1ae;
    }
  }
  puVar8 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_1d0,(ulong)local_188._M_dataplus._M_p);
LAB_0014d1ae:
  local_210 = (undefined8 *)*puVar8;
  puVar1 = puVar8 + 2;
  if (local_210 == puVar1) {
    local_200 = *puVar1;
    uStack_1f8 = puVar8[3];
    local_210 = &local_200;
  }
  else {
    local_200 = *puVar1;
  }
  local_208 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_210);
  local_1b0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar5;
  pbVar11 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar5 + 2);
  if (local_1b0._M_head_impl == pbVar11) {
    local_1a0 = *(long *)pbVar11;
    lStack_198 = plVar5[3];
    local_1b0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a0;
  }
  else {
    local_1a0 = *(long *)pbVar11;
  }
  local_1a8 = plVar5[1];
  *plVar5 = (long)pbVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1b0);
  local_1f0._M_dataplus._M_p = (pointer)*plVar5;
  psVar12 = (size_type *)(plVar5 + 2);
  if ((size_type *)local_1f0._M_dataplus._M_p == psVar12) {
    local_1f0.field_2._M_allocated_capacity = *psVar12;
    local_1f0.field_2._8_8_ = plVar5[3];
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  }
  else {
    local_1f0.field_2._M_allocated_capacity = *psVar12;
  }
  local_1f0._M_string_length = plVar5[1];
  *plVar5 = (long)psVar12;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1f0);
  local_128[0]._M_dataplus._M_p = (pointer)*plVar5;
  psVar12 = (size_type *)(plVar5 + 2);
  if ((size_type *)local_128[0]._M_dataplus._M_p == psVar12) {
    local_128[0].field_2._0_8_ = *psVar12;
    local_128[0].field_2._8_8_ = plVar5[3];
    local_128[0]._M_dataplus._M_p = (pointer)&local_128[0].field_2;
  }
  else {
    local_128[0].field_2._0_8_ = *psVar12;
  }
  local_128[0]._M_string_length = plVar5[1];
  *plVar5 = (long)psVar12;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  DeathTestAbort(local_128);
}

Assistant:

void DeathTestImpl::ReadAndInterpretStatusByte() {
  char flag;
  int bytes_read;

  // The read() here blocks until data is available (signifying the
  // failure of the death test) or until the pipe is closed (signifying
  // its success), so it's okay to call this in the parent before
  // the child process has exited.
  do {
    bytes_read = posix::Read(read_fd(), &flag, 1);
  } while (bytes_read == -1 && errno == EINTR);

  if (bytes_read == 0) {
    set_outcome(DIED);
  } else if (bytes_read == 1) {
    switch (flag) {
      case kDeathTestReturned:
        set_outcome(RETURNED);
        break;
      case kDeathTestThrew:
        set_outcome(THREW);
        break;
      case kDeathTestLived:
        set_outcome(LIVED);
        break;
      case kDeathTestInternalError:
        FailFromInternalError(read_fd());  // Does not return.
        break;
      default:
        GTEST_LOG_(FATAL) << "Death test child process reported "
                          << "unexpected status byte ("
                          << static_cast<unsigned int>(flag) << ")";
    }
  } else {
    GTEST_LOG_(FATAL) << "Read from death test child process failed: "
                      << GetLastErrnoDescription();
  }
  GTEST_DEATH_TEST_CHECK_SYSCALL_(posix::Close(read_fd()));
  set_read_fd(-1);
}